

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O3

Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> * __thiscall
capnp::compiler::BrandScope::getParams
          (Maybe<kj::ArrayPtr<capnp::compiler::BrandedDecl>_> *__return_storage_ptr__,
          BrandScope *this,uint64_t scopeId)

{
  size_t sVar1;
  bool bVar2;
  Fault f;
  Fault local_10;
  
  do {
    if (this->leafId == scopeId) {
      bVar2 = this->inherited == false;
      if (bVar2) {
        sVar1 = (this->params).size_;
        (__return_storage_ptr__->ptr).field_1.value.ptr = (this->params).ptr;
        (__return_storage_ptr__->ptr).field_1.value.size_ = sVar1;
      }
      (__return_storage_ptr__->ptr).isSet = bVar2;
      return __return_storage_ptr__;
    }
    this = (this->parent).ptr.ptr;
  } while (this != (BrandScope *)0x0);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
             ,0x169,FAILED,(char *)0x0,"\"scope is not a parent\"",
             (char (*) [22])"scope is not a parent");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

kj::Maybe<kj::ArrayPtr<BrandedDecl>> BrandScope::getParams(uint64_t scopeId) {
  // Returns null if params at the requested scope should be inherited from the client scope.

  if (scopeId == leafId) {
    if (inherited) {
      return kj::none;
    } else {
      return params.asPtr();
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->getParams(scopeId);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}